

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm.h
# Opt level: O2

ymfm_output<4> * __thiscall ymfm::ymfm_output<4>::clamp16(ymfm_output<4> *this)

{
  uint32_t index;
  long lVar1;
  int iVar2;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    iVar2 = this->data[lVar1];
    if (0x7ffe < iVar2) {
      iVar2 = 0x7fff;
    }
    if (iVar2 < -0x7fff) {
      iVar2 = -0x8000;
    }
    this->data[lVar1] = iVar2;
  }
  return this;
}

Assistant:

ymfm_output &clamp16()
	{
		for (uint32_t index = 0; index < NumOutputs; index++)
			data[index] = clamp(data[index], -32768, 32767);
		return *this;
	}